

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

int32_t __thiscall icu_63::LocalizationInfo::indexForLocale(LocalizationInfo *this,UChar *locale)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    iVar2 = (*this->_vptr_LocalizationInfo[5])(this);
    if (iVar2 <= (int)uVar3) {
      return -1;
    }
    iVar2 = (*this->_vptr_LocalizationInfo[6])(this,(ulong)uVar3);
    UVar1 = streq(locale,(UChar *)CONCAT44(extraout_var,iVar2));
    if (UVar1 != '\0') break;
    uVar3 = uVar3 + 1;
  }
  return uVar3;
}

Assistant:

int32_t
LocalizationInfo::indexForLocale(const UChar* locale) const {
    for (int i = 0; i < getNumberOfDisplayLocales(); ++i) {
        if (streq(locale, getLocaleName(i))) {
            return i;
        }
    }
    return -1;
}